

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.cpp
# Opt level: O2

void SHRotate(rot_data_t *c_in,rot_data_t *c_out,mat4f *m,int lmax)

{
  long lVar1;
  mat4f *pmVar2;
  rot_data_t *c_out_00;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  uint extraout_XMM0_Db_01;
  uint extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dc_01;
  uint extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  uint extraout_XMM0_Dd_01;
  uint extraout_XMM0_Dd_02;
  undefined8 uStack_70;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  ulong local_58;
  ulong uStack_50;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_48 = SQRT(*(float *)(m + 0x24) * *(float *)(m + 0x24) +
                  *(float *)(m + 0x20) * *(float *)(m + 0x20));
  if (local_48 <= 1.9073486e-06) {
    uStack_70 = 0x1745f8;
    local_48 = atan2f(local_48,*(float *)(m + 0x28));
    fVar3 = -*(float *)(m + 0x10);
    pmVar2 = m + 0x14;
    local_58 = 0;
    uStack_50 = 0;
    uStack_44 = extraout_XMM0_Db_01;
    uStack_40 = extraout_XMM0_Dc_01;
    uStack_3c = extraout_XMM0_Dd_01;
  }
  else {
    pmVar2 = m + 0x20;
    uStack_70 = 0x1745bc;
    fVar3 = atan2f(*(float *)(m + 0x18),-*(float *)(m + 8));
    local_58 = CONCAT44(extraout_XMM0_Db,fVar3) ^ 0x8000000080000000;
    uStack_50 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) ^ 0x8000000080000000;
    uStack_70 = 0x1745d8;
    local_48 = atan2f(local_48,*(float *)(m + 0x28));
    fVar3 = *(float *)(m + 0x24);
    uStack_44 = extraout_XMM0_Db_00;
    uStack_40 = extraout_XMM0_Dc_00;
    uStack_3c = extraout_XMM0_Dd_00;
  }
  uStack_3c = uStack_3c ^ 0x80000000;
  uStack_40 = uStack_40 ^ 0x80000000;
  uStack_44 = uStack_44 ^ 0x80000000;
  local_48 = -local_48;
  uStack_70 = 0x174629;
  local_68 = atan2f(fVar3,*(float *)pmVar2);
  local_68 = -local_68;
  uStack_64 = extraout_XMM0_Db_02 ^ 0x80000000;
  uStack_60 = extraout_XMM0_Dc_02 ^ 0x80000000;
  uStack_5c = extraout_XMM0_Dd_02 ^ 0x80000000;
  lVar1 = -((ulong)(uint)((lmax + 1) * (lmax + 1)) * 4 + 0xf & 0x3fffffff0);
  c_out_00 = (rot_data_t *)((long)&local_68 + lVar1);
  fVar3 = (float)local_58;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x174669;
  SHRotateZ(c_in,c_out,fVar3,lmax);
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x174676;
  SHRotateXPlus(c_out,c_out_00,lmax);
  fVar3 = local_48;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x174687;
  SHRotateZ(c_out_00,c_out,fVar3,lmax);
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x174694;
  SHRotateXMinus(c_out,c_out_00,lmax);
  fVar3 = local_68;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1746a5;
  SHRotateZ(c_out_00,c_out,fVar3,lmax);
  return;
}

Assistant:

void SHRotate(const rot_data_t *c_in, rot_data_t *c_out, const mat4f &m, int lmax)
{
    float alpha, beta, gamma;
    toZYZ(m, &alpha, &beta, &gamma);
    rot_data_t work[SHTerms(lmax)];
    SHRotateZ(c_in, c_out, gamma, lmax);
    SHRotateXPlus(c_out, work, lmax);
    SHRotateZ(work, c_out, beta, lmax);
    SHRotateXMinus(c_out, work, lmax);
    SHRotateZ(work, c_out, alpha, lmax);
}